

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cc
# Opt level: O3

vector<double,_std::allocator<double>_> *
gmath::realRoots(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Polynomiald *p)

{
  int iVar1;
  double *pdVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  int hn;
  ulong uVar6;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  double dVar8;
  SturmChaind s;
  SturmChain<double> local_48;
  double local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = p->used;
  if (iVar5 == 3) {
    pdVar2 = p->c;
    dVar7 = pdVar2[1];
    dVar8 = pdVar2[2];
    uStack_30 = 0;
    local_38 = dVar7 * dVar7 + dVar8 * -4.0 * *pdVar2;
    if (local_38 <= 0.0) {
      if ((local_38 == 0.0) && (!NAN(local_38))) {
        local_48._0_8_ = -dVar7 / (dVar8 + dVar8);
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,(iterator)0x0,(double *)&local_48);
      }
    }
    else {
      if (local_38 < 0.0) {
        local_38 = sqrt(local_38);
        uStack_30 = extraout_XMM0_Qb;
      }
      else {
        local_38 = SQRT(local_38);
      }
      iVar5 = p->used;
      dVar7 = 0.0;
      local_48._0_8_ = local_38;
      if (1 < iVar5) {
        local_48._0_8_ = local_38 - p->c[1];
        if (iVar5 != 2) {
          dVar7 = p->c[2];
          dVar7 = dVar7 + dVar7;
        }
      }
      local_48._0_8_ = (double)local_48._0_8_ / dVar7;
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar3,(double *)&local_48);
        iVar5 = p->used;
      }
      else {
        *iVar3._M_current = (double)local_48._0_8_;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      if (iVar5 < 2) {
        local_48._0_8_ = -local_38;
        dVar7 = 0.0;
      }
      else {
        local_48._0_8_ = -p->c[1] - local_38;
        dVar7 = 0.0;
        if (iVar5 != 2) {
          dVar7 = p->c[2];
          dVar7 = dVar7 + dVar7;
        }
      }
      local_48._0_8_ = (double)local_48._0_8_ / dVar7;
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar3,(double *)&local_48);
      }
      else {
        *iVar3._M_current = (double)local_48._0_8_;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
    }
  }
  else if (iVar5 == 2) {
    local_48._0_8_ = -*p->c / p->c[1];
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,(iterator)0x0,(double *)&local_48);
  }
  else if (3 < iVar5) {
    SturmChain<double>::SturmChain(&local_48,p);
    iVar5 = SturmChain<double>::countSignChangesNegInf(&local_48);
    hn = SturmChain<double>::countSignChangesPosInf(&local_48);
    if (hn < iVar5) {
      iVar1 = p->used;
      uVar6 = (ulong)(iVar1 - 1U);
      dVar7 = 0.0;
      if (1 < iVar1) {
        do {
          dVar8 = 0.0;
          if ((int)uVar6 <= iVar1) {
            dVar8 = p->c[uVar6 - 1];
          }
          dVar7 = dVar7 + ABS(dVar8);
          bVar4 = 1 < uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar4);
      }
      dVar7 = dVar7 / ABS(p->c[(int)(iVar1 - 1U)]);
      if (dVar7 <= 1.0) {
        dVar7 = 1.0;
      }
      dVar7 = dVar7 * 1e-12 + dVar7;
      anon_unknown_3::findRoots(__return_storage_ptr__,&local_48,-dVar7,dVar7,iVar5,hn);
    }
    SturmChain<double>::~SturmChain(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> realRoots(const Polynomiald &p)
{
  std::vector<double> ret;

  // call direct solution, if the degree is <= 3

  if (p.getDegree() == 1) // compute solution to first degree in closed form
  {
    ret.push_back(-p[0]/p[1]);
  }
  else if (p.getDegree() == 2) // compute solution to second degree in closed form
  {
    double v;

    v=p[1]*p[1]-4*p[2]*p[0];

    if (v > 0)
    {
      v=sqrt(v);

      ret.push_back((-p[1]+v)/(2*p[2]));
      ret.push_back((-p[1]-v)/(2*p[2]));
    }
    else if (v == 0)
    {
      ret.push_back(-p[1]/(2*p[2]));
    }
  }
  else if (p.getDegree() > 2) // compute solutions of higher degrees using Sturm chains
  {
    SturmChaind s(p);
    int ln=s.countSignChangesNegInf();
    int hn=s.countSignChangesPosInf();

    if (ln-hn > 0)
    {
      // determine radius around the origin that contains all roots using
      // Gerschgorins theorem

      double r=0;

      int i=p.getDegree()-1;
      if (i >= 0)
      {
        while (i >= 0)
        {
          r+=std::abs(p[i]);
          i--;
        }
      }

      r/=std::abs(p[p.getDegree()]);
      r=std::max(1.0, r);
      r+=r*1e-12;

      // recursively determine all roots

      findRoots(ret, s, -r, r, ln, hn);
    }
  }

  return ret;
}